

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(AttributeSpec *this)

{
  AttributeSpec *this_local;
  
  this->inputType = INPUTTYPE_LAST;
  this->outputType = OUTPUTTYPE_LAST;
  this->storage = STORAGE_LAST;
  this->usage = USAGE_LAST;
  this->componentCount = 0;
  this->offset = 0;
  this->stride = 0;
  this->normalize = false;
  this->instanceDivisor = 0;
  this->useDefaultAttribute = false;
  this->additionalPositionAttribute = false;
  this->bgraComponentOrder = false;
  return;
}

Assistant:

DrawTestSpec::AttributeSpec::AttributeSpec (void)
{
	inputType					= DrawTestSpec::INPUTTYPE_LAST;
	outputType					= DrawTestSpec::OUTPUTTYPE_LAST;
	storage						= DrawTestSpec::STORAGE_LAST;
	usage						= DrawTestSpec::USAGE_LAST;
	componentCount				= 0;
	offset						= 0;
	stride						= 0;
	normalize					= false;
	instanceDivisor				= 0;
	useDefaultAttribute			= false;
	additionalPositionAttribute = false;
	bgraComponentOrder			= false;
}